

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * QByteArray::trimmed_helper(QByteArray *__return_storage_ptr__,QByteArray *a)

{
  char *pcVar1;
  long lVar2;
  Data *pDVar3;
  qsizetype qVar4;
  char *data;
  char *pcVar5;
  TrimPositions TVar6;
  
  TVar6 = QStringAlgorithms<QByteArray>::trimmed_helper_positions(a);
  pcVar5 = TVar6.end;
  data = TVar6.begin;
  pcVar1 = (a->d).ptr;
  if ((data == pcVar1) && (lVar2 = (a->d).size, pcVar5 == pcVar1 + lVar2)) {
    pDVar3 = (a->d).d;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = pcVar1;
    (__return_storage_ptr__->d).size = lVar2;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    pDVar3 = (a->d).d;
    if ((pDVar3 == (Data *)0x0) ||
       ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
      QByteArray(__return_storage_ptr__,data,(long)pcVar5 - (long)data);
    }
    else {
      if (data != pcVar1) {
        memmove(pcVar1,data,(long)pcVar5 - (long)data);
      }
      resize(a,(long)pcVar5 - (long)data);
      pDVar3 = (a->d).d;
      pcVar1 = (a->d).ptr;
      (a->d).d = (Data *)0x0;
      (a->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).d = pDVar3;
      (__return_storage_ptr__->d).ptr = pcVar1;
      qVar4 = (a->d).size;
      (a->d).size = 0;
      (__return_storage_ptr__->d).size = qVar4;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QByteArray::trimmed_helper(QByteArray &a)
{
    return QStringAlgorithms<QByteArray>::trimmed_helper(a);
}